

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O2

REStackFrame * __thiscall
icu_63::RegexMatcher::StateSave
          (RegexMatcher *this,REStackFrame *fp,int64_t savePatIdx,UErrorCode *status)

{
  int iVar1;
  REStackFrame *pRVar2;
  long lVar3;
  long lVar4;
  
  pRVar2 = fp;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pRVar2 = (REStackFrame *)UVector64::reserveBlock(this->fStack,this->fFrameSize,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      lVar3 = (long)this->fFrameSize;
      lVar4 = 0;
      do {
        *(undefined8 *)((long)pRVar2->fExtra + lVar4 + -0x10) =
             *(undefined8 *)((long)pRVar2 + lVar4 + lVar3 * -8);
        lVar4 = lVar4 + 8;
      } while (lVar3 * 8 != lVar4);
      iVar1 = this->fTickCounter;
      this->fTickCounter = iVar1 + -1;
      if (iVar1 < 2) {
        IncrementTime(this,status);
      }
      *(int64_t *)((long)pRVar2 + lVar3 * -8 + 8) = savePatIdx;
    }
    else {
      *status = U_REGEX_STACK_OVERFLOW;
      pRVar2 = fp;
    }
  }
  return pRVar2;
}

Assistant:

inline REStackFrame *RegexMatcher::StateSave(REStackFrame *fp, int64_t savePatIdx, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return fp;
    }
    // push storage for a new frame.
    int64_t *newFP = fStack->reserveBlock(fFrameSize, status);
    if (U_FAILURE(status)) {
        // Failure on attempted stack expansion.
        //   Stack function set some other error code, change it to a more
        //   specific one for regular expressions.
        status = U_REGEX_STACK_OVERFLOW;
        // We need to return a writable stack frame, so just return the
        //    previous frame.  The match operation will stop quickly
        //    because of the error status, after which the frame will never
        //    be looked at again.
        return fp;
    }
    fp = (REStackFrame *)(newFP - fFrameSize);  // in case of realloc of stack.

    // New stack frame = copy of old top frame.
    int64_t *source = (int64_t *)fp;
    int64_t *dest   = newFP;
    for (;;) {
        *dest++ = *source++;
        if (source == newFP) {
            break;
        }
    }

    fTickCounter--;
    if (fTickCounter <= 0) {
       IncrementTime(status);    // Re-initializes fTickCounter
    }
    fp->fPatIdx = savePatIdx;
    return (REStackFrame *)newFP;
}